

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.cc
# Opt level: O0

void __thiscall hrvo::KdTree::build(KdTree *this)

{
  value_type __x;
  bool bVar1;
  size_type sVar2;
  vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_> *this_00;
  long *in_RDI;
  size_t i;
  size_t in_stack_000000b8;
  size_t in_stack_000000c0;
  size_t in_stack_000000c8;
  KdTree *in_stack_000000d0;
  value_type *in_stack_ffffffffffffff78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff98;
  long *__new_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffa0;
  long *plVar3;
  size_t in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffd8;
  ulong local_10;
  
  plVar3 = in_RDI + 1;
  std::vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>::size
            ((vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_> *)(*in_RDI + 0x20));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 1));
  while( true ) {
    sVar2 = std::vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>::size
                      ((vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_> *)(*in_RDI + 0x20));
    if (sVar2 <= local_10) break;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    local_10 = local_10 + 1;
  }
  __new_size = in_RDI + 4;
  sVar2 = std::vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>::size
                    ((vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_> *)(*in_RDI + 0x20));
  this_00 = (vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_> *)(sVar2 * 2 + -1);
  Node::Node((Node *)&stack0xffffffffffffffc0);
  __x.end_ = (size_t)in_RDI;
  __x.begin_ = (size_t)plVar3;
  __x.left_ = in_stack_ffffffffffffffc0;
  __x.right_ = in_stack_ffffffffffffffc8;
  __x.maxX_ = (float)(int)in_stack_ffffffffffffffd0;
  __x.maxY_ = (float)(int)(in_stack_ffffffffffffffd0 >> 0x20);
  __x._40_8_ = in_stack_ffffffffffffffd8;
  std::vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>::resize
            (this_00,(size_type)__new_size,__x);
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    (in_stack_ffffffffffffffd8);
  if (!bVar1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 1));
    buildRecursive(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
  }
  return;
}

Assistant:

void KdTree::build() {
  agents_.reserve(simulator_->agents_.size());

  for (std::size_t i = agents_.size(); i < simulator_->agents_.size(); ++i) {
    agents_.push_back(i);
  }

  nodes_.resize(2U * simulator_->agents_.size() - 1U);

  if (!agents_.empty()) {
    buildRecursive(0U, agents_.size(), 0U);
  }
}